

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Sintatico::funcao(Sintatico *this)

{
  eat(this,0x23);
  identificador(this);
  parametros_formais(this);
  eat(this,0xb);
  identificador(this);
  eat(this,0x15);
  bloco(this);
  eat(this,0x15);
  return;
}

Assistant:

void Sintatico::funcao() {
  eat(FUNCTION);
  identificador();
  parametros_formais();
  eat(DOISPONTOS);
  identificador();
  eat(PONTOVIRGULA);
  bloco();
  eat(PONTOVIRGULA);
}